

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O3

QByteArray *
qEncodeHmacMd5(QByteArray *__return_storage_ptr__,QByteArray *key,QByteArrayView message)

{
  QArrayData *pQVar1;
  char *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  storage_type *psVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QCryptographicHash hash;
  QArrayData *local_98;
  char *pcStack_90;
  ulong local_88;
  QByteArray local_78;
  QByteArray local_58;
  undefined1 *local_40;
  long local_38;
  
  QVar12.m_data = (storage_type *)message.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QCryptographicHash::QCryptographicHash((QCryptographicHash *)&local_40,Md5);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&local_58,0x40,'6');
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&local_78,0x40,'\\');
  QCryptographicHash::reset();
  psVar5 = (storage_type *)(key->d).size;
  if ((storage_type *)0x40 < psVar5) {
    QVar9.m_data = psVar5;
    QVar9.m_size = (qsizetype)&local_40;
    QCryptographicHash::addData(QVar9);
    QCryptographicHash::result();
    pQVar1 = &((key->d).d)->super_QArrayData;
    pcVar2 = (key->d).ptr;
    (key->d).d = (Data *)local_98;
    (key->d).ptr = pcStack_90;
    uVar7 = (key->d).size;
    (key->d).size = local_88;
    local_98 = pQVar1;
    pcStack_90 = pcVar2;
    local_88 = uVar7;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,1,0x10);
      }
    }
  }
  QByteArray::leftJustified((longlong)&local_98,(char)key,true);
  pQVar1 = &((key->d).d)->super_QArrayData;
  pcVar2 = (key->d).ptr;
  (key->d).d = (Data *)local_98;
  (key->d).ptr = pcStack_90;
  qVar3 = (key->d).size;
  (key->d).size = local_88;
  uVar7 = local_88;
  local_98 = pQVar1;
  pcStack_90 = pcVar2;
  local_88 = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,1,0x10);
    }
    uVar7 = (key->d).size;
  }
  if (uVar7 != 0) {
    uVar6 = 0;
    do {
      pDVar4 = (key->d).d;
      if ((pDVar4 == (Data *)0x0) ||
         (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QByteArray::reallocData((longlong)key,(AllocationOption)uVar7);
      }
      bVar8 = (key->d).ptr[uVar6];
      if ((&(local_58.d.d)->super_QArrayData == (QArrayData *)0x0) ||
         (1 < ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QByteArray::reallocData((longlong)&local_58,(AllocationOption)local_58.d.size);
        bVar8 = bVar8 ^ local_58.d.ptr[uVar6];
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) goto LAB_001a6a74;
LAB_001a6a7b:
        QByteArray::reallocData((longlong)&local_58,(AllocationOption)local_58.d.size);
      }
      else {
        bVar8 = bVar8 ^ local_58.d.ptr[uVar6];
LAB_001a6a74:
        if (1 < ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)
        goto LAB_001a6a7b;
      }
      local_58.d.ptr[uVar6] = bVar8;
      uVar6 = uVar6 + 1;
      uVar7 = (key->d).size;
    } while (uVar6 < uVar7);
    if (uVar7 != 0) {
      uVar6 = 0;
      do {
        pDVar4 = (key->d).d;
        if ((pDVar4 == (Data *)0x0) ||
           (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QByteArray::reallocData((longlong)key,(AllocationOption)uVar7);
        }
        bVar8 = (key->d).ptr[uVar6];
        if ((&(local_78.d.d)->super_QArrayData == (QArrayData *)0x0) ||
           (1 < ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QByteArray::reallocData((longlong)&local_78,(AllocationOption)local_78.d.size);
          bVar8 = bVar8 ^ local_78.d.ptr[uVar6];
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) goto LAB_001a6b1e;
LAB_001a6b25:
          QByteArray::reallocData((longlong)&local_78,(AllocationOption)local_78.d.size);
        }
        else {
          bVar8 = bVar8 ^ local_78.d.ptr[uVar6];
LAB_001a6b1e:
          if (1 < ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)
          goto LAB_001a6b25;
        }
        local_78.d.ptr[uVar6] = bVar8;
        uVar6 = uVar6 + 1;
        uVar7 = (key->d).size;
      } while (uVar6 < uVar7);
    }
  }
  QVar12.m_size = local_58.d.size;
  QByteArray::insert((longlong)&local_58,QVar12);
  QCryptographicHash::reset();
  QVar10.m_data = (storage_type *)local_58.d.size;
  QVar10.m_size = (qsizetype)&local_40;
  QCryptographicHash::addData(QVar10);
  psVar5 = (storage_type *)QCryptographicHash::resultView();
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QVar13.m_data = psVar5;
  QVar13.m_size = local_78.d.size;
  QByteArray::insert((longlong)&local_78,QVar13);
  QCryptographicHash::reset();
  QVar11.m_data = (storage_type *)local_78.d.size;
  QVar11.m_size = (qsizetype)&local_40;
  QCryptographicHash::addData(QVar11);
  QCryptographicHash::result();
  pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
  pcVar2 = (__return_storage_ptr__->d).ptr;
  (__return_storage_ptr__->d).d = (Data *)local_98;
  (__return_storage_ptr__->d).ptr = pcStack_90;
  qVar3 = (__return_storage_ptr__->d).size;
  (__return_storage_ptr__->d).size = local_88;
  local_98 = pQVar1;
  pcStack_90 = pcVar2;
  local_88 = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,1,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
  QCryptographicHash::~QCryptographicHash((QCryptographicHash *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray qEncodeHmacMd5(QByteArray &key, QByteArrayView message)
{
    Q_ASSERT_X(!(message.isEmpty()),"qEncodeHmacMd5", "Empty message check");
    Q_ASSERT_X(!(key.isEmpty()),"qEncodeHmacMd5", "Empty key check");

    QCryptographicHash hash(QCryptographicHash::Md5);

    QByteArray iKeyPad(blockSize, 0x36);
    QByteArray oKeyPad(blockSize, 0x5c);

    hash.reset();
    // Adjust the key length to blockSize

    if (blockSize < key.size()) {
        hash.addData(key);
        key = hash.result(); //MD5 will always return 16 bytes length output
    }

    //Key will be <= 16 or 20 bytes as hash function (MD5 or SHA hash algorithms)
    //key size can be max of Block size only
    key = key.leftJustified(blockSize,0,true);

    //iKeyPad, oKeyPad and key are all of same size "blockSize"

    //xor of iKeyPad with Key and store the result into iKeyPad
    for(int i = 0; i<key.size();i++) {
        iKeyPad[i] = key[i]^iKeyPad[i];
    }

    //xor of oKeyPad with Key and store the result into oKeyPad
    for(int i = 0; i<key.size();i++) {
        oKeyPad[i] = key[i]^oKeyPad[i];
    }

    iKeyPad.append(message); // (K0 xor ipad) || text

    hash.reset();
    hash.addData(iKeyPad);
    QByteArrayView hMsg = hash.resultView();
                    //Digest gen after pass-1: H((K0 xor ipad)||text)

    QByteArray hmacDigest;
    oKeyPad.append(hMsg);
    hash.reset();
    hash.addData(oKeyPad);
    hmacDigest = hash.result();
                    // H((K0 xor opad )|| H((K0 xor ipad) || text))

    /*hmacDigest should not be less than half the length of the HMAC output
      (to match the birthday attack bound) and not less than 80 bits
      (a suitable lower bound on the number of bits that need to be
      predicted by an attacker).
      Refer RFC 2104 for more details on truncation part */

    /*MD5 hash always returns 16 byte digest only and HMAC-MD5 spec
      (RFC 2104) also says digest length should be 16 bytes*/
    return hmacDigest;
}